

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O0

void OnDiskDataset::merge
               (path *db_base,string *outname,
               vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets,
               TaskSpec *task)

{
  string_view_t fmt;
  string_view_t fmt_00;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  runtime_error *prVar4;
  const_reference ppOVar5;
  ostream *poVar6;
  string *psVar7;
  OnDiskFileIndex *this;
  uint64_t uVar8;
  reference ppOVar9;
  long in_RCX;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_RDX;
  pair<std::_Rb_tree_const_iterator<IndexType>,_bool> pVar10;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  OnDiskDataset *ds;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1_2;
  ofstream of;
  string fname_list;
  OnDiskIndex *index_2;
  OnDiskDataset *dataset;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range2_1;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> indexes;
  string index_name;
  IndexType *ndxtype;
  iterator __end1_1;
  iterator __begin1_1;
  set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *__range1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_names;
  stringstream ss_1;
  OnDiskIndex *index_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *__range2;
  set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> tmp_types;
  size_t i_1;
  OnDiskIndex *index;
  const_iterator __end1;
  const_iterator __begin1;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *__range1;
  stringstream ss;
  size_t i;
  set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> index_types;
  OnDiskDataset *in_stack_fffffffffffff5b8;
  OnDiskDataset *in_stack_fffffffffffff5c0;
  OnDiskIndex *in_stack_fffffffffffff5c8;
  IndexMergeHelper *in_stack_fffffffffffff5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5d8;
  path *in_stack_fffffffffffff5e0;
  path *in_stack_fffffffffffff5e8;
  OnDiskDataset *in_stack_fffffffffffff5f0;
  OnDiskIndex *in_stack_fffffffffffff5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff608;
  IndexType in_stack_fffffffffffff60c;
  TaskSpec *in_stack_fffffffffffff6b0;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *in_stack_fffffffffffff6b8;
  undefined8 in_stack_fffffffffffff6c0;
  value_type in_stack_fffffffffffff6c8;
  undefined7 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d7;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> local_910;
  long *local_8f8;
  OnDiskDataset *local_8d0;
  OnDiskDataset **local_8c8;
  __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_8c0;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *local_8b8;
  long local_830 [23];
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffff888;
  OnDiskFileIndex *in_stack_fffffffffffff890;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff940;
  string *in_stack_fffffffffffff948;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff950;
  string *in_stack_fffffffffffff958;
  path *in_stack_fffffffffffff960;
  _Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
  in_stack_fffffffffffff970;
  string local_630 [32];
  string local_610 [112];
  OnDiskIndex *local_5a0;
  OnDiskDataset *local_598;
  OnDiskDataset **local_590;
  __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_588;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *local_580;
  _Base_ptr local_560;
  undefined1 local_558;
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [48];
  reference local_4c0;
  _Self local_4b8;
  _Self local_4b0;
  undefined1 *local_4a8;
  undefined1 local_469;
  string local_468 [32];
  stringstream local_448 [16];
  ostream local_438 [376];
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  IndexType local_2ac;
  reference local_2a8;
  OnDiskIndex *local_2a0;
  __normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
  local_298;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *local_290;
  ulong local_258;
  _Base_ptr local_250;
  undefined1 local_248;
  IndexType local_23c;
  reference local_238;
  OnDiskIndex *local_230;
  __normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
  local_228;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *local_220;
  undefined1 local_211;
  string local_210 [32];
  stringstream local_1f0 [16];
  ostream local_1e0 [376];
  ulong local_68;
  undefined1 local_50 [48];
  long local_20;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_>::set
            ((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)0x1a3514);
  sVar3 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size(local_18)
  ;
  if (sVar3 < 2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"merge requires at least 2 datasets");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68 = 1;
  while( true ) {
    uVar1 = local_68;
    sVar3 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                      (local_18);
    if (sVar3 <= uVar1) {
      ppOVar5 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::
                operator[](local_18,0);
      local_220 = &(*ppOVar5)->indices;
      local_228._M_current =
           (OnDiskIndex *)
           std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::begin
                     ((vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *)in_stack_fffffffffffff5b8
                     );
      local_230 = (OnDiskIndex *)
                  std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::end
                            ((vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *)
                             in_stack_fffffffffffff5b8);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                            *)in_stack_fffffffffffff5c0,
                           (__normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                            *)in_stack_fffffffffffff5b8);
        if (!bVar2) break;
        local_238 = __gnu_cxx::
                    __normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                    ::operator*(&local_228);
        local_23c = OnDiskIndex::index_type(local_238);
        pVar10 = std::set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_>::insert
                           ((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)
                            in_stack_fffffffffffff5e0,(value_type *)in_stack_fffffffffffff5d8);
        local_250 = (_Base_ptr)pVar10.first._M_node;
        local_248 = pVar10.second;
        __gnu_cxx::
        __normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
        ::operator++(&local_228);
      }
      local_258 = 1;
      while( true ) {
        uVar1 = local_258;
        sVar3 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                          (local_18);
        if (sVar3 <= uVar1) {
          if (local_20 != 0) {
            std::set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_>::size
                      ((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)0x1a3cdd)
            ;
            TaskSpec::estimate_work
                      ((TaskSpec *)in_stack_fffffffffffff5c0,(uint64_t)in_stack_fffffffffffff5b8);
          }
          spdlog::debug<char[39]>((char (*) [39])0x1a3d01);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x1a3d10);
          local_4a8 = local_50;
          local_4b0._M_node =
               (_Base_ptr)
               std::set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_>::begin
                         ((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)
                          in_stack_fffffffffffff5b8);
          local_4b8._M_node =
               (_Base_ptr)
               std::set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_>::end
                         ((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)
                          in_stack_fffffffffffff5b8);
          while( true ) {
            bVar2 = std::operator!=(&local_4b0,&local_4b8);
            if (!bVar2) break;
            local_4c0 = std::_Rb_tree_const_iterator<IndexType>::operator*
                                  ((_Rb_tree_const_iterator<IndexType> *)0x1a3d75);
            ::fmt::v6::basic_string_view<char>::basic_string_view
                      ((basic_string_view<char> *)in_stack_fffffffffffff5c0,
                       (char *)in_stack_fffffffffffff5b8);
            get_index_type_name_abi_cxx11_(in_stack_fffffffffffff60c);
            fmt.size_ = (size_t)in_stack_fffffffffffff5d0;
            fmt.data_ = (char *)in_stack_fffffffffffff5c8;
            spdlog::debug<std::__cxx11::string>(fmt,&in_stack_fffffffffffff5c0->name);
            std::__cxx11::string::~string(local_4f0);
            get_index_type_name_abi_cxx11_(in_stack_fffffffffffff60c);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff5c8,&in_stack_fffffffffffff5c0->name);
            std::__cxx11::string::~string(local_530);
            std::__cxx11::string::~string(local_550);
            pVar11 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
            local_560 = (_Base_ptr)pVar11.first._M_node;
            local_558 = pVar11.second;
            std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::vector
                      ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)0x1a3e8d);
            local_580 = local_18;
            local_588._M_current =
                 (OnDiskDataset **)
                 std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                           ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *
                            )in_stack_fffffffffffff5b8);
            local_590 = (OnDiskDataset **)
                        std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::
                        end((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *
                            )in_stack_fffffffffffff5b8);
            while( true ) {
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                                  *)in_stack_fffffffffffff5c0,
                                 (__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                                  *)in_stack_fffffffffffff5b8);
              if (!bVar2) break;
              ppOVar9 = __gnu_cxx::
                        __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                        ::operator*(&local_588);
              local_598 = *ppOVar9;
              local_5a0 = get_index_with_type(in_stack_fffffffffffff5f0,
                                              (IndexType)((ulong)in_stack_fffffffffffff5e8 >> 0x20))
              ;
              this = std::optional<OnDiskFileIndex>::operator->
                               ((optional<OnDiskFileIndex> *)0x1a3f46);
              uVar8 = OnDiskFileIndex::get_file_count(this);
              in_stack_fffffffffffff60c = (IndexType)uVar8;
              OnDiskIndex::read_run_offsets(in_stack_fffffffffffff5f8);
              IndexMergeHelper::IndexMergeHelper
                        (in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,
                         (uint32_t)((ulong)in_stack_fffffffffffff5c0 >> 0x20),
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffff5b8);
              std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::
              emplace_back<IndexMergeHelper>
                        ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
                         in_stack_fffffffffffff5d0,(IndexMergeHelper *)in_stack_fffffffffffff5c8);
              IndexMergeHelper::~IndexMergeHelper((IndexMergeHelper *)0x1a3fb9);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffff5d0);
              __gnu_cxx::
              __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
              ::operator++(&local_588);
            }
            ::fmt::v6::basic_string_view<char>::basic_string_view
                      ((basic_string_view<char> *)in_stack_fffffffffffff5c0,
                       (char *)in_stack_fffffffffffff5b8);
            get_index_type_name_abi_cxx11_(in_stack_fffffffffffff60c);
            fmt_00.size_ = (size_t)in_stack_fffffffffffff5d0;
            fmt_00.data_ = (char *)in_stack_fffffffffffff5c8;
            spdlog::debug<std::__cxx11::string>(fmt_00,&in_stack_fffffffffffff5c0->name);
            std::__cxx11::string::~string(local_610);
            OnDiskIndex::on_disk_merge
                      ((path *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                       &in_stack_fffffffffffff6c8->name,
                       (IndexType)((ulong)in_stack_fffffffffffff6c0 >> 0x20),
                       in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
            std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::~vector
                      ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
                       in_stack_fffffffffffff5d0);
            std::__cxx11::string::~string(local_510);
            std::_Rb_tree_const_iterator<IndexType>::operator++
                      ((_Rb_tree_const_iterator<IndexType> *)in_stack_fffffffffffff5c0);
          }
          spdlog::debug<char[22]>((char (*) [22])0x1a41df);
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                         in_stack_fffffffffffff600);
          std::ofstream::ofstream(local_830);
          std::ios::exceptions((int)local_830 + (int)*(undefined8 *)(local_830[0] + -0x18));
          std::experimental::filesystem::v1::__cxx11::path::
          path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                    (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
          std::experimental::filesystem::v1::__cxx11::operator/
                    (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0);
          std::basic_ofstream<char,_std::char_traits<char>_>::
          open<std::experimental::filesystem::v1::__cxx11::path>
                    ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff5d0,
                     (path *)in_stack_fffffffffffff5c8,
                     (openmode)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)in_stack_fffffffffffff5c0)
          ;
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)in_stack_fffffffffffff5c0)
          ;
          local_8b8 = local_18;
          local_8c0._M_current =
               (OnDiskDataset **)
               std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                         ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                          in_stack_fffffffffffff5b8);
          local_8c8 = (OnDiskDataset **)
                      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::
                      end((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                          in_stack_fffffffffffff5b8);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                                *)in_stack_fffffffffffff5c0,
                               (__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                                *)in_stack_fffffffffffff5b8);
            if (!bVar2) break;
            ppOVar9 = __gnu_cxx::
                      __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                      ::operator*(&local_8c0);
            local_8d0 = *ppOVar9;
            std::optional<OnDiskFileIndex>::operator->((optional<OnDiskFileIndex> *)0x1a4325);
            local_8f8 = local_830;
            std::function<void(std::__cxx11::string_const&)>::
            function<OnDiskDataset::merge(std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&,TaskSpec*)::__0,void>
                      ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)in_stack_fffffffffffff5d0,
                       (anon_class_8_1_3fcf6695 *)in_stack_fffffffffffff5c8);
            OnDiskFileIndex::for_each_filename(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
            std::
            function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)0x1a4372);
            __gnu_cxx::
            __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
            ::operator++(&local_8c0);
          }
          std::ostream::flush();
          std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
                    (&local_910);
          ppOVar5 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::
                    operator[](local_18,0);
          get_taints_abi_cxx11_(*ppOVar5);
          store_dataset(in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                        in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                        (optional<std::basic_string_view<char,_std::char_traits<char>_>_>)
                        in_stack_fffffffffffff970,in_stack_fffffffffffff940);
          spdlog::debug<char[29]>((char (*) [29])0x1a44c7);
          std::ofstream::~ofstream(local_830);
          std::__cxx11::string::~string(local_630);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1a44f0);
          std::set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_>::~set
                    ((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)0x1a44fd);
          return;
        }
        std::set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_>::set
                  ((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)0x1a3971);
        ppOVar5 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::
                  operator[](local_18,local_258);
        local_290 = &(*ppOVar5)->indices;
        local_298._M_current =
             (OnDiskIndex *)
             std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::begin
                       ((vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *)
                        in_stack_fffffffffffff5b8);
        local_2a0 = (OnDiskIndex *)
                    std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::end
                              ((vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *)
                               in_stack_fffffffffffff5b8);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                              *)in_stack_fffffffffffff5c0,
                             (__normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                              *)in_stack_fffffffffffff5b8);
          if (!bVar2) break;
          local_2a8 = __gnu_cxx::
                      __normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                      ::operator*(&local_298);
          local_2ac = OnDiskIndex::index_type(local_2a8);
          pVar10 = std::set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_>::insert
                             ((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)
                              in_stack_fffffffffffff5e0,(value_type *)in_stack_fffffffffffff5d8);
          local_2c0 = (_Base_ptr)pVar10.first._M_node;
          local_2b8 = pVar10.second;
          __gnu_cxx::
          __normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
          ::operator++(&local_298);
        }
        bVar2 = std::operator!=((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)
                                in_stack_fffffffffffff5c0,
                                (set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)
                                in_stack_fffffffffffff5b8);
        if (bVar2) break;
        std::set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_>::~set
                  ((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)0x1a3c8a);
        local_258 = local_258 + 1;
      }
      std::__cxx11::stringstream::stringstream(local_448);
      poVar6 = std::operator<<(local_438,"trying to merge \"");
      ppOVar5 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::
                operator[](local_18,0);
      psVar7 = get_name_abi_cxx11_(*ppOVar5);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      poVar6 = std::operator<<(poVar6,"\" and \"");
      ppOVar5 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::
                operator[](local_18,local_258);
      psVar7 = get_name_abi_cxx11_(*ppOVar5);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      std::operator<<(poVar6,"\" ");
      std::operator<<(local_438,"but these ones contain index(es) of different type(s)");
      local_469 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar4,local_468);
      local_469 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppOVar5 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator[]
                        (local_18,0);
    in_stack_fffffffffffff6c8 = *ppOVar5;
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator[]
              (local_18,local_68);
    in_stack_fffffffffffff6d7 =
         is_taint_compatible(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
    if (!(bool)in_stack_fffffffffffff6d7) break;
    local_68 = local_68 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1f0);
  poVar6 = std::operator<<(local_1e0,"trying to merge \"");
  ppOVar5 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator[]
                      (local_18,0);
  psVar7 = get_name_abi_cxx11_(*ppOVar5);
  poVar6 = std::operator<<(poVar6,(string *)psVar7);
  poVar6 = std::operator<<(poVar6,"\" and \"");
  ppOVar5 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator[]
                      (local_18,local_68);
  psVar7 = get_name_abi_cxx11_(*ppOVar5);
  poVar6 = std::operator<<(poVar6,(string *)psVar7);
  std::operator<<(poVar6,"\" ");
  std::operator<<(local_1e0,"but they have different taints - aborting");
  local_211 = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar4,local_210);
  local_211 = 0;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OnDiskDataset::merge(const fs::path &db_base, const std::string &outname,
                          const std::vector<const OnDiskDataset *> &datasets,
                          TaskSpec *task) {
    std::set<IndexType> index_types;

    if (datasets.size() < 2) {
        throw std::runtime_error("merge requires at least 2 datasets");
    }

    for (size_t i = 1; i < datasets.size(); i++) {
        if (!datasets[0]->is_taint_compatible(*datasets[i])) {
            std::stringstream ss;
            ss << "trying to merge \"" << datasets[0]->get_name() << "\" and \""
               << datasets[i]->get_name() << "\" ";
            ss << "but they have different taints - aborting";
            throw std::runtime_error(ss.str());
        }
    }

    for (const OnDiskIndex &index : datasets[0]->indices) {
        index_types.insert(index.index_type());
    }

    for (size_t i = 1; i < datasets.size(); i++) {
        std::set<IndexType> tmp_types;

        for (const OnDiskIndex &index : datasets[i]->indices) {
            tmp_types.insert(index.index_type());
        }

        if (tmp_types != index_types) {
            std::stringstream ss;
            ss << "trying to merge \"" << datasets[0]->get_name() << "\" and \""
               << datasets[i]->get_name() << "\" ";
            ss << "but these ones contain index(es) of different type(s)";
            throw std::runtime_error(ss.str());
        }
    }

    if (task != nullptr) {
        task->estimate_work(NUM_TRIGRAMS * index_types.size());
    }

    spdlog::debug("Pre-checks succeeded, merge can begin.");

    std::set<std::string> index_names;
    for (const auto &ndxtype : index_types) {
        spdlog::debug("Load run offsets: {}.", get_index_type_name(ndxtype));
        std::string index_name = get_index_type_name(ndxtype) + "." + outname;
        index_names.insert(index_name);
        std::vector<IndexMergeHelper> indexes;
        for (const OnDiskDataset *dataset : datasets) {
            const OnDiskIndex &index = dataset->get_index_with_type(ndxtype);
            indexes.emplace_back(
                IndexMergeHelper(&index, dataset->files_index->get_file_count(),
                                 index.read_run_offsets()));
        }
        spdlog::debug("On disk merge: {}.", get_index_type_name(ndxtype));
        OnDiskIndex::on_disk_merge(db_base, index_name, ndxtype, indexes, task);
    }

    spdlog::debug("Merge filename lists.");

    std::string fname_list = "files." + outname;
    std::ofstream of;
    of.exceptions(std::ofstream::badbit);
    of.open(db_base / fname_list, std::ofstream::binary);

    for (const OnDiskDataset *ds : datasets) {
        ds->files_index->for_each_filename(
            [&of](const std::string &fname) { of << fname << "\n"; });
    }
    of.flush();

    store_dataset(db_base, outname, index_names, fname_list, std::nullopt,
                  datasets[0]->get_taints());

    spdlog::debug("Merge finished successfully.");
}